

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,FieldDef *field,bool force_signed)

{
  bool bVar1;
  char *pcVar2;
  BaseType type;
  string local_90;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string suffix;
  allocator<char> local_35;
  BaseType local_34;
  Value *pVStack_30;
  BaseType base_type;
  Value *value;
  FieldDef *pFStack_20;
  bool force_signed_local;
  FieldDef *field_local;
  KotlinGenerator *this_local;
  string *val;
  
  pVStack_30 = &field->value;
  local_34 = (field->value).type.base_type;
  value._7_1_ = force_signed;
  pFStack_20 = field;
  field_local = (FieldDef *)this;
  this_local = (KotlinGenerator *)__return_storage_ptr__;
  bVar1 = FieldDef::IsScalarOptional(field);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_35);
    std::allocator<char>::~allocator(&local_35);
  }
  else {
    bVar1 = IsFloat(local_34);
    if (bVar1) {
      suffix.field_2._M_local_buf[0xb] = '\0';
      FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                (__return_storage_ptr__,
                 (FloatConstantGenerator *)(anonymous_namespace)::KotlinFloatGen,pFStack_20);
      if ((local_34 == BASE_TYPE_DOUBLE) &&
         (pcVar2 = (char *)std::__cxx11::string::back(), *pcVar2 == 'f')) {
        std::__cxx11::string::pop_back();
      }
    }
    else if (local_34 == BASE_TYPE_BOOL) {
      bVar1 = std::operator==(&pVStack_30->constant,"0");
      pcVar2 = "true";
      if (bVar1) {
        pcVar2 = "false";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,pcVar2,
                 (allocator<char> *)(suffix.field_2._M_local_buf + 10));
      std::allocator<char>::~allocator((allocator<char> *)(suffix.field_2._M_local_buf + 10));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"",&local_69);
      std::allocator<char>::~allocator(&local_69);
      if ((local_34 == BASE_TYPE_LONG) || ((value._7_1_ & 1) == 0)) {
        LiteralSuffix_abi_cxx11_(&local_90,(KotlinGenerator *)(ulong)local_34,type);
        std::__cxx11::string::operator=((string *)local_68,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::operator+(__return_storage_ptr__,&pVStack_30->constant,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultValue(const FieldDef &field,
                              bool force_signed = false) const {
    auto &value = field.value;
    auto base_type = field.value.type.base_type;

    if (field.IsScalarOptional()) { return "null"; }
    if (IsFloat(base_type)) {
      auto val = KotlinFloatGen.GenFloatConstant(field);
      if (base_type == BASE_TYPE_DOUBLE && val.back() == 'f') {
        val.pop_back();
      }
      return val;
    }

    if (base_type == BASE_TYPE_BOOL) {
      return value.constant == "0" ? "false" : "true";
    }

    std::string suffix = "";

    if (base_type == BASE_TYPE_LONG || !force_signed) {
      suffix = LiteralSuffix(base_type);
    }
    return value.constant + suffix;
  }